

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_test.cpp
# Opt level: O2

void __thiscall license::test::print_and_read::test_method(print_and_read *this)

{
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar1;
  ostream *poVar2;
  HwIdentifier id2;
  HwIdentifier pc_id;
  array<unsigned_char,_7UL> local_e0;
  undefined1 local_d8;
  undefined8 local_d0;
  shared_count sStack_c8;
  string pc_id_str;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  
  builtin_memcpy(local_e0._M_elems,"BBBBBBB",7);
  hw_identifier::HwIdentifier::HwIdentifier(&pc_id);
  hw_identifier::HwIdentifier::set_data(&pc_id,&local_e0);
  hw_identifier::HwIdentifier::set_identification_strategy(&pc_id,STRATEGY_ETHERNET);
  hw_identifier::HwIdentifier::print_abi_cxx11_(&pc_id_str,&pc_id);
  poVar2 = std::operator<<((ostream *)std::cout,(string *)&pc_id_str);
  std::endl<char,std::char_traits<char>>(poVar2);
  hw_identifier::HwIdentifier::HwIdentifier(&id2,&pc_id_str);
  local_30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
  ;
  local_28 = "";
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0x3c);
  LVar1 = hw_identifier::HwIdentifier::get_identification_strategy(&id2);
  local_d8 = LVar1 == STRATEGY_ETHERNET;
  local_d0 = 0;
  sStack_c8.pi_ = (sp_counted_base *)0x0;
  local_58 = 0;
  local_60 = &PTR__lazy_ostream_001aa7a8;
  local_50 = boost::unit_test::lazy_ostream::inst;
  local_48 = "Strategy decoded correctly";
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_c8);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
  ;
  local_78 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x3d);
  local_d8 = hw_identifier::HwIdentifier::data_match(&id2,&local_e0);
  local_d0 = 0;
  sStack_c8.pi_ = (sp_counted_base *)0x0;
  local_58 = 0;
  local_60 = &PTR__lazy_ostream_001aa7e8;
  local_50 = boost::unit_test::lazy_ostream::inst;
  local_48 = "Data deserialized correctly";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_c8);
  hw_identifier::HwIdentifier::~HwIdentifier(&id2);
  std::__cxx11::string::~string((string *)&pc_id_str);
  hw_identifier::HwIdentifier::~HwIdentifier(&pc_id);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(print_and_read) {
	array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> data = {0x42, 0x42, 0x42, 0x42, 0x42, 0x42, 0x42};
	HwIdentifier pc_id;
	pc_id.set_data(data);
	pc_id.set_identification_strategy(LCC_API_HW_IDENTIFICATION_STRATEGY::STRATEGY_ETHERNET);
	string pc_id_str = pc_id.print();
	cout << pc_id_str << endl;
	const HwIdentifier id2(pc_id_str);
	BOOST_CHECK_MESSAGE(id2.get_identification_strategy() == LCC_API_HW_IDENTIFICATION_STRATEGY::STRATEGY_ETHERNET,
						"Strategy decoded correctly");
	BOOST_CHECK_MESSAGE(id2.data_match(data), "Data deserialized correctly");
}